

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::clear(QWidgetLineControl *this)

{
  qsizetype qVar1;
  QWidgetLineControl *in_RDI;
  bool in_stack_0000000a;
  bool in_stack_0000000b;
  int priorState;
  QWidgetLineControl *in_stack_00000040;
  
  *(undefined4 *)(in_RDI + 0x110) = 0;
  qVar1 = QString::size((QString *)(in_RDI + 0x18));
  *(int *)(in_RDI + 0x114) = (int)qVar1;
  removeSelectedText(in_stack_00000040);
  separate(in_RDI);
  finishChange(this,priorState,in_stack_0000000b,in_stack_0000000a);
  return;
}

Assistant:

void QWidgetLineControl::clear()
{
    int priorState = m_undoState;
    m_selstart = 0;
    m_selend = m_text.size();
    removeSelectedText();
    separate();
    finishChange(priorState, /*update*/false, /*edited*/false);
}